

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O0

bool tinyusdz::pathutil::ValidatePropPath(Path *path,string *err)

{
  bool bVar1;
  string *psVar2;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *err_local;
  Path *path_local;
  
  local_20 = err;
  err_local = &path->_prim_part;
  psVar2 = Path::prop_part_abi_cxx11_(path);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            psVar2,":");
  if (bVar1) {
    if (local_20 != (string *)0x0) {
      ::std::__cxx11::string::operator=
                ((string *)local_20,"Proparty path is composed of namespace delimiter only(`:`).");
    }
    path_local._7_1_ = false;
  }
  else {
    psVar2 = Path::prop_part_abi_cxx11_((Path *)err_local);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_40,":",&local_41);
    bVar1 = startsWith((string *)psVar2,(string *)local_40);
    ::std::__cxx11::string::~string(local_40);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (bVar1) {
      if (local_20 != (string *)0x0) {
        ::std::__cxx11::string::operator=
                  ((string *)local_20,"Property path starts with namespace delimiter(`:`).");
      }
      path_local._7_1_ = false;
    }
    else {
      psVar2 = Path::prop_part_abi_cxx11_((Path *)err_local);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_68,":",&local_69);
      bVar1 = endsWith(psVar2,&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if (bVar1) {
        if (local_20 != (string *)0x0) {
          ::std::__cxx11::string::operator=
                    ((string *)local_20,"Property path ends with namespace delimiter(`:`).");
        }
        path_local._7_1_ = false;
      }
      else {
        psVar2 = Path::prop_part_abi_cxx11_((Path *)err_local);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_90,"::",&local_91);
        bVar1 = contains_str(psVar2,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
        if (bVar1) {
          if (local_20 != (string *)0x0) {
            ::std::__cxx11::string::operator=
                      ((string *)local_20,
                       "Empty path among namespace delimiters(`::`) in Property path.");
          }
          path_local._7_1_ = false;
        }
        else {
          path_local._7_1_ = true;
        }
      }
    }
  }
  return path_local._7_1_;
}

Assistant:

bool ValidatePropPath(const Path &path, std::string *err) {
  if (path.prop_part() == ":") {
    if (err) {
      (*err) = "Proparty path is composed of namespace delimiter only(`:`).";
    }
    return false;
  }

  if (startsWith(path.prop_part(), ":")) {
    if (err) {
      (*err) = "Property path starts with namespace delimiter(`:`).";
    }
    return false;
  }

  if (endsWith(path.prop_part(), ":")) {
    if (err) {
      (*err) = "Property path ends with namespace delimiter(`:`).";
    }
    return false;
  }

  if (contains_str(path.prop_part(), "::")) {
    if (err) {
      (*err) = "Empty path among namespace delimiters(`::`) in Property path.";
    }
    return false;
  }

  // TODO: more validation

  return true;

}